

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

char * mg_get_mime_type(char *path,char *default_mime_type)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  __int32_t **pp_Var4;
  long lVar5;
  char *pcVar6;
  anon_struct_24_3_312ce1a4 *paVar7;
  long lVar8;
  long lVar9;
  
  sVar3 = strlen(path);
  pcVar6 = ".html";
  lVar8 = 0;
  paVar7 = static_builtin_mime_types;
  do {
    lVar9 = sVar3 - paVar7->ext_len;
    if (paVar7->ext_len <= sVar3 && lVar9 != 0) {
      pp_Var4 = __ctype_tolower_loc();
      lVar5 = 0;
      do {
        iVar1 = (*pp_Var4)[(byte)path[lVar5 + lVar9]];
        iVar2 = (*pp_Var4)[(byte)pcVar6[lVar5]];
        if (path[lVar5 + lVar9] == 0) break;
        lVar5 = lVar5 + 1;
      } while (iVar1 == iVar2);
      if (iVar1 == iVar2) {
        return paVar7->mime_type;
      }
    }
    lVar8 = lVar8 + 1;
    paVar7 = static_builtin_mime_types + lVar8;
    pcVar6 = paVar7->extension;
    if (lVar8 == 0x2f) {
      return default_mime_type;
    }
  } while( true );
}

Assistant:

const char *mg_get_mime_type(const char *path, const char *default_mime_type) {
  const char *ext;
  size_t i, path_len;

  path_len = strlen(path);

  for (i = 0; static_builtin_mime_types[i].extension != NULL; i++) {
    ext = path + (path_len - static_builtin_mime_types[i].ext_len);
    if (path_len > static_builtin_mime_types[i].ext_len &&
        mg_strcasecmp(ext, static_builtin_mime_types[i].extension) == 0) {
      return static_builtin_mime_types[i].mime_type;
    }
  }

  return default_mime_type;
}